

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

null_terminating_iterator<char> __thiscall
fmt::v5::internal::
parse_arg_id<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
          (internal *this,null_terminating_iterator<char> it,
          id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
          *handler)

{
  internal iVar1;
  uint id;
  internal *piVar2;
  type tVar3;
  id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
  *this_00;
  internal *piVar4;
  long value;
  basic_string_view<char> id_00;
  null_terminating_iterator<char> nVar5;
  null_terminating_iterator<char> local_28;
  
  this_00 = (id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
             *)it.end_;
  piVar4 = (internal *)it.ptr_;
  local_28.end_ = (char *)piVar4;
  local_28.ptr_ = (char *)this;
  if (this == piVar4) {
    iVar1 = (internal)0x0;
  }
  else {
    iVar1 = *this;
    if ((iVar1 == (internal)0x7d) || (iVar1 == (internal)0x3a)) {
      id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
      ::operator()(this_00);
      local_28.end_ = (char *)piVar4;
      goto LAB_0012c804;
    }
    if ((byte)((char)iVar1 - 0x30U) < 10) {
      id = parse_nonnegative_int<fmt::v5::internal::null_terminating_iterator<char>,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>&>
                     (&local_28,this_00);
      if ((local_28.ptr_ == local_28.end_) ||
         (((internal)*local_28.ptr_ != (internal)0x3a &&
          ((internal)*local_28.ptr_ != (internal)0x7d)))) {
        id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
        ::on_error(this_00,"invalid format string");
      }
      else {
        id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
        ::operator()(this_00,id);
      }
      goto LAB_0012c804;
    }
  }
  if ((iVar1 == (internal)0x5f) || ((byte)(((byte)iVar1 & 0xdf) + 0xbf) < 0x1a)) {
    value = 0;
    piVar2 = this + 1;
    do {
      local_28.ptr_ = (char *)piVar2;
      if ((internal *)local_28.ptr_ == piVar4) {
        iVar1 = (internal)0x0;
      }
      else {
        iVar1 = (internal)*local_28.ptr_;
      }
      piVar2 = (internal *)local_28.ptr_ + 1;
      value = value + 1;
    } while ((((byte)((char)iVar1 - 0x30U) < 10) || (iVar1 == (internal)0x5f)) ||
            ((byte)(((byte)iVar1 & 0xdf) + 0xbf) < 0x1a));
    tVar3 = to_unsigned<long>(value);
    id_00.size_ = tVar3;
    id_00.data_ = (char *)this;
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
    ::operator()(this_00,id_00);
    local_28.end_ = (char *)piVar4;
  }
  else {
    id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
    ::on_error(this_00,"invalid format string");
    local_28.end_ = (char *)piVar4;
  }
LAB_0012c804:
  nVar5.end_ = local_28.end_;
  nVar5.ptr_ = local_28.ptr_;
  return nVar5;
}

Assistant:

FMT_CONSTEXPR Iterator parse_arg_id(Iterator it, IDHandler &&handler) {
  typedef typename std::iterator_traits<Iterator>::value_type char_type;
  char_type c = *it;
  if (c == '}' || c == ':') {
    handler();
    return it;
  }
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(it, handler);
    if (*it != '}' && *it != ':') {
      handler.on_error("invalid format string");
      return it;
    }
    handler(index);
    return it;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return it;
  }
  auto start = it;
  do {
    c = *++it;
  } while (is_name_start(c) || ('0' <= c && c <= '9'));
  handler(basic_string_view<char_type>(
            pointer_from(start), to_unsigned(it - start)));
  return it;
}